

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  uint *puVar1;
  long lVar2;
  byte bVar3;
  uint64_t uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  TValue *pTVar8;
  uint narray;
  ulong uVar9;
  long lVar10;
  GCtab *t;
  
  uVar6 = lj_lib_checkint(L,1);
  if ((uVar6 == 0) || (uVar4 = (L->glref).ptr64, *(uint *)(uVar4 + 0x46c) <= uVar6)) {
    lj_lib_checkint(L,2);
    iVar7 = 0;
  }
  else {
    lVar5 = *(long *)(*(long *)(uVar4 + 0x460) + (ulong)uVar6 * 8);
    uVar6 = lj_lib_checkint(L,2);
    iVar7 = 0;
    if ((lVar5 != 0) && (uVar6 < *(ushort *)(lVar5 + 10))) {
      puVar1 = (uint *)(*(long *)(lVar5 + 0x30) + (ulong)uVar6 * 0xc);
      uVar6 = *puVar1;
      lVar5 = *(long *)(lVar5 + 0x38);
      bVar3 = *(byte *)((long)puVar1 + 10);
      narray = bVar3 + 2;
      lua_createtable(L,narray,0);
      t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
      if (t->asize == 0) {
        pTVar8 = lj_tab_setinth(L,t,0);
      }
      else {
        pTVar8 = (TValue *)(t->array).ptr64;
      }
      pTVar8->n = (double)(int)((ushort)puVar1[1] - 0x8000);
      if (t->asize < 2) {
        pTVar8 = lj_tab_setinth(L,t,1);
      }
      else {
        pTVar8 = (TValue *)((t->array).ptr64 + 8);
      }
      pTVar8->n = (double)(byte)puVar1[2];
      if ((ulong)bVar3 != 0) {
        uVar9 = 2;
        lVar10 = 0x10;
        do {
          if (uVar9 < t->asize) {
            pTVar8 = (TValue *)((t->array).ptr64 + lVar10);
          }
          else {
            pTVar8 = lj_tab_setinth(L,t,(int32_t)uVar9);
          }
          pTVar8->n = (double)*(int *)((ulong)uVar6 * 4 + lVar5 + -8 + uVar9 * 4);
          lVar10 = lVar10 + 8;
          lVar2 = uVar9 - bVar3;
          uVar9 = uVar9 + 1;
        } while (lVar2 != 1);
      }
      if (narray < t->asize) {
        pTVar8 = (TValue *)((ulong)(narray * 8) + (t->array).ptr64);
      }
      else {
        pTVar8 = lj_tab_setinth(L,t,narray);
      }
      pTVar8->u64 = 0xc170000000000000;
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}